

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_shm_latency.cpp
# Opt level: O0

void parent(void)

{
  undefined1 *this;
  uint uVar1;
  Writer *__p;
  Reader *__p_00;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  Message *message_pointer_2;
  Message *message_pointer;
  Message *message_pointer_1;
  int i;
  vector<char,_std::allocator<char>_> recv;
  vector<char,_std::allocator<char>_> data;
  timespec last_message_recv_time;
  timespec first_message_send_time;
  Message message;
  undefined1 local_70 [8];
  shared_ptr<diffusion::Reader> in_reader;
  duration<long,_std::ratio<1L,_1000L>_> local_58 [3];
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [8];
  shared_ptr<diffusion::Writer> out_writer;
  
  pcVar4 = shm_out_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar4,&local_39);
  __p = diffusion::create_shared_memory_writer(&local_38,0x1000000);
  std::shared_ptr<diffusion::Writer>::shared_ptr<diffusion::Writer,void>
            ((shared_ptr<diffusion::Writer> *)local_18,__p);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)local_58,
             (int *)((long)&in_reader.
                            super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_58);
  pcVar4 = shm_in_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message.is_last_message,pcVar4,
             (allocator<char> *)((long)&message.num_passes + 3));
  __p_00 = diffusion::create_shared_memory_reader((string *)&message.is_last_message);
  std::shared_ptr<diffusion::Reader>::shared_ptr<diffusion::Reader,void>
            ((shared_ptr<diffusion::Reader> *)local_70,__p_00);
  std::__cxx11::string::~string((string *)&message.is_last_message);
  std::allocator<char>::~allocator((allocator<char> *)((long)&message.num_passes + 3));
  message.pad[0x1dc] = '\0';
  message.pad[0x1d8] = '\0';
  message.pad[0x1d9] = '\0';
  message.pad[0x1da] = '\0';
  message.pad[0x1db] = '\0';
  clock_gettime(0,(timespec *)&last_message_recv_time.tv_nsec);
  diffusion::to_vector_char
            ((vector<char,_std::allocator<char>_> *)
             &recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (char *)((long)&first_message_send_time.tv_nsec + 4),0x1e8);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&i,0x1e8,
             (allocator_type *)((long)&message_pointer_1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&message_pointer_1 + 7));
  for (message_pointer_1._0_4_ = 1; (int)message_pointer_1 < 1000000;
      message_pointer_1._0_4_ = (int)message_pointer_1 + 1) {
    peVar2 = std::__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
    (**peVar2->_vptr_Writer)
              (peVar2,&recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    do {
      peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
      uVar1 = (**peVar3->_vptr_Reader)();
    } while ((uVar1 & 1) == 0);
    peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    (*peVar3->_vptr_Reader[2])
              (peVar3,&recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)
                        &recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    *(int *)(pcVar4 + 0x1e0) = *(int *)(pcVar4 + 0x1e0) + 1;
  }
  this = &recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  pcVar4 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)this);
  pcVar4[0x1e4] = '\x01';
  peVar2 = std::__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  (**peVar2->_vptr_Writer)(peVar2,this);
  do {
    peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    uVar1 = (**peVar3->_vptr_Reader)();
  } while ((uVar1 & 1) == 0);
  peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  (*peVar3->_vptr_Reader[2])
            (peVar3,&recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)
                      &recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  *(int *)(pcVar5 + 0x1e0) = *(int *)(pcVar5 + 0x1e0) + 1;
  clock_gettime(0,(timespec *)
                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::operator<<((ostream *)&std::cout,"First message send time: ");
  print((timespec *)&last_message_recv_time.tv_nsec);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Last message recv time : ");
  print((timespec *)&data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Number of message passes = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)(pcVar4 + 0x1e0));
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &recv.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::shared_ptr<diffusion::Reader>::~shared_ptr((shared_ptr<diffusion::Reader> *)local_70);
  std::shared_ptr<diffusion::Writer>::~shared_ptr((shared_ptr<diffusion::Writer> *)local_18);
  return;
}

Assistant:

void parent() {
    auto out_writer = std::shared_ptr<diffusion::Writer>(diffusion::create_shared_memory_writer(shm_out_name, shm_size));
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    auto in_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_shared_memory_reader(shm_in_name));
    Message message;
    message.is_last_message = false;
    message.num_passes = 0;
    ::timespec first_message_send_time;
    ::timespec last_message_recv_time;
    ::clock_gettime(CLOCK_REALTIME, &first_message_send_time);
    auto data = diffusion::to_vector_char(reinterpret_cast<char const *>(&message), sizeof(message));
    std::vector<char> recv(sizeof(Message));
    for (int i = 1; i < times; ++i) {
        out_writer->write(data);
        while (true) {
            if (in_reader->can_read()) {
                in_reader->read(data);
                auto message_pointer = reinterpret_cast<Message *>(data.data());
                ++message_pointer->num_passes;
                break;
            }
        }
    }
    auto message_pointer = reinterpret_cast<Message *>(data.data());
    message_pointer->is_last_message = true;
    out_writer->write(data);
    while (true) {
        if (in_reader->can_read()) {
            in_reader->read(data);
            auto message_pointer = reinterpret_cast<Message *>(data.data());
            ++message_pointer->num_passes;
            break;
        }
    }
    ::clock_gettime(CLOCK_REALTIME, &last_message_recv_time);
    std::cout << "First message send time: "; print(first_message_send_time); std::cout << std::endl;
    std::cout << "Last message recv time : "; print(last_message_recv_time); std::cout << std::endl;
    std::cout << "Number of message passes = " << message_pointer->num_passes << std::endl;
}